

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

void __thiscall
icu_63::Locale::setKeywordValue
          (Locale *this,StringPiece keywordName,StringPiece keywordValue,UErrorCode *status)

{
  char *keywordName_00;
  char *keywordValue_00;
  StringPiece s;
  StringPiece s_00;
  undefined1 local_c8 [8];
  CharString keywordValue_nul;
  undefined1 local_78 [8];
  CharString keywordName_nul;
  UErrorCode *status_local;
  Locale *this_local;
  StringPiece keywordValue_local;
  StringPiece keywordName_local;
  
  keywordValue_nul._56_8_ = keywordName.ptr_;
  s._12_4_ = 0;
  s.ptr_ = (char *)SUB128(keywordName._0_12_,0);
  s.length_ = SUB124(keywordName._0_12_,8);
  keywordName_nul._56_8_ = status;
  CharString::CharString((CharString *)local_78,s,status);
  s_00._12_4_ = 0;
  s_00.ptr_ = (char *)SUB128(keywordValue._0_12_,0);
  s_00.length_ = SUB124(keywordValue._0_12_,8);
  CharString::CharString((CharString *)local_c8,s_00,(UErrorCode *)keywordName_nul._56_8_);
  keywordName_00 = CharString::data((CharString *)local_78);
  keywordValue_00 = CharString::data((CharString *)local_c8);
  setKeywordValue(this,keywordName_00,keywordValue_00,(UErrorCode *)keywordName_nul._56_8_);
  CharString::~CharString((CharString *)local_c8);
  CharString::~CharString((CharString *)local_78);
  return;
}

Assistant:

void
Locale::setKeywordValue(StringPiece keywordName,
                        StringPiece keywordValue,
                        UErrorCode& status) {
    // TODO: Remove the need for a const char* to a NUL terminated buffer.
    const CharString keywordName_nul(keywordName, status);
    const CharString keywordValue_nul(keywordValue, status);
    setKeywordValue(keywordName_nul.data(), keywordValue_nul.data(), status);
}